

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathRandom.h
# Opt level: O1

Vec3<float> __thiscall
Imath_2_5::hollowSphereRand<Imath_2_5::Vec3<float>,Imath_2_5::Rand32>(Imath_2_5 *this,Rand32 *rand)

{
  uint i;
  long lVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Vec3<float> VVar6;
  Vec3<float> v;
  Vec3<float> local_30;
  
  lVar1 = 0;
  do {
    do {
      do {
        fVar2 = (float)Imath_2_5::Rand32::nextf();
        (&local_30.x)[lVar1] = fVar2 - (1.0 - fVar2);
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
      uVar3 = 0;
      fVar2 = local_30.z * local_30.z + local_30.x * local_30.x + local_30.y * local_30.y;
      if (2.3509887e-38 <= fVar2) {
        if (fVar2 < 0.0) {
          fVar2 = sqrtf(fVar2);
          uVar3 = extraout_XMM0_Db_00;
        }
        else {
          fVar2 = SQRT(fVar2);
        }
      }
      else {
        fVar2 = Vec3<float>::lengthTiny(&local_30);
        uVar3 = extraout_XMM0_Db;
      }
      lVar1 = 0;
    } while (1.0 < fVar2);
    lVar1 = 0;
  } while ((fVar2 == 0.0) && (!NAN(fVar2)));
  VVar6.z = local_30.z / fVar2;
  auVar4._4_4_ = local_30.y;
  auVar4._0_4_ = local_30.x;
  auVar4._8_8_ = 0;
  auVar5._4_4_ = fVar2;
  auVar5._0_4_ = fVar2;
  auVar5._8_4_ = uVar3;
  auVar5._12_4_ = uVar3;
  auVar5 = divps(auVar4,auVar5);
  *(long *)this = auVar5._0_8_;
  *(float *)(this + 8) = VVar6.z;
  VVar6.y = fVar2;
  VVar6.x = fVar2;
  return VVar6;
}

Assistant:

Vec
hollowSphereRand (Rand &rand)
{
    Vec v;
    typename Vec::BaseType length;

    do
    {
	for (unsigned int i = 0; i < Vec::dimensions(); i++)
	    v[i] = (typename Vec::BaseType) rand.nextf (-1, 1);

	length = v.length();
    }
    while (length > 1 || length == 0);

    return v / length;
}